

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pci.c
# Opt level: O1

void remove_driver(char *pci_addr)

{
  long lVar1;
  uint32_t uVar2;
  uint uVar3;
  int iVar4;
  uint __fd;
  int iVar5;
  size_t __n;
  char *__s;
  char *pcVar6;
  __off_t _Var7;
  ssize_t sVar8;
  void *vaddr;
  ulong uVar9;
  undefined8 extraout_RAX;
  long *plVar10;
  uintptr_t *puVar11;
  undefined8 extraout_RAX_00;
  uint extraout_EDX;
  undefined1 *puVar12;
  char cVar13;
  ushort *__buf;
  long *__buf_00;
  long lVar14;
  long *plVar15;
  uintptr_t *virt;
  ulong uVar16;
  dma_memory dVar17;
  char buf [512];
  char path [4096];
  undefined8 uVar18;
  long *plVar19;
  long alStack_3878 [66];
  undefined1 *puStack_3668;
  char *pcStack_3660;
  long alStack_3648 [64];
  char acStack_3448 [4096];
  ulong uStack_2448;
  char *pcStack_2440;
  ulong uStack_2438;
  ushort uStack_2422;
  undefined1 auStack_2420 [512];
  char acStack_2220 [4096];
  code *pcStack_1220;
  undefined1 auStack_1218 [512];
  char local_1018 [4096];
  
  puVar12 = auStack_1218;
  pcStack_1220 = (code *)0x104ac7;
  snprintf(local_1018,0x1000,"/sys/bus/pci/devices/%s/driver/unbind",pci_addr);
  pcStack_1220 = (code *)0x104ad6;
  uVar3 = open(local_1018,1);
  if (uVar3 == 0xffffffff) {
    pcStack_1220 = (code *)0x104b1f;
    remove_driver_cold_2();
    return;
  }
  pcStack_1220 = (code *)0x104ae5;
  __n = strlen(pci_addr);
  pcStack_1220 = (code *)0x104af2;
  __s = (char *)write(uVar3,pci_addr,__n);
  pcStack_1220 = (code *)0x104afd;
  pcVar6 = (char *)strlen(pci_addr);
  if (__s != pcVar6) {
    pcStack_1220 = (code *)0x104b4f;
    fprintf(_stderr,"[WARN ] %s:%d %s(): failed to unload driver for device %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/emmericp[P]ixy/src/pci.c",0x15,
            "remove_driver");
  }
  pcStack_1220 = (code *)0x104b09;
  iVar4 = close(uVar3);
  if (iVar4 != -1) {
    return;
  }
  pcStack_1220 = enable_dma;
  remove_driver_cold_1();
  uStack_2438 = 0x104b82;
  pcStack_1220 = (code *)pci_addr;
  snprintf(acStack_2220,0x1000,"/sys/bus/pci/devices/%s/config",puVar12);
  uStack_2438 = 0x104b91;
  __fd = open(acStack_2220,2);
  if (__fd == 0xffffffff) {
    uStack_2438 = 0x104c1f;
    enable_dma_cold_2();
LAB_00104c1f:
    uStack_2438 = 0x104c3e;
    __assert_fail("lseek(fd, 4, SEEK_SET) == 4",
                  "/workspace/llm4binary/github/license_c_cmakelists/emmericp[P]ixy/src/pci.c",0x20,
                  "void enable_dma(const char *)");
  }
  uStack_2438 = 0x104ba6;
  _Var7 = lseek(__fd,4,0);
  if (_Var7 != 4) goto LAB_00104c1f;
  uStack_2422 = 0;
  uStack_2438 = 0x104bc2;
  sVar8 = read(__fd,&uStack_2422,2);
  if (sVar8 != 2) {
    uStack_2438 = 0x104c5d;
    __assert_fail("read(fd, &dma, 2) == 2",
                  "/workspace/llm4binary/github/license_c_cmakelists/emmericp[P]ixy/src/pci.c",0x22,
                  "void enable_dma(const char *)");
  }
  uStack_2422 = uStack_2422 | 4;
  uStack_2438 = 0x104bdb;
  _Var7 = lseek(__fd,4,0);
  if (_Var7 != 4) {
    uStack_2438 = 0x104c7c;
    __assert_fail("lseek(fd, 4, SEEK_SET) == 4",
                  "/workspace/llm4binary/github/license_c_cmakelists/emmericp[P]ixy/src/pci.c",0x24,
                  "void enable_dma(const char *)");
  }
  __buf = &uStack_2422;
  uStack_2438 = 0x104bf2;
  sVar8 = write(__fd,__buf,2);
  cVar13 = (char)__buf;
  if (sVar8 != 2) {
    uStack_2438 = 0x104c9b;
    __assert_fail("write(fd, &dma, 2) == 2",
                  "/workspace/llm4binary/github/license_c_cmakelists/emmericp[P]ixy/src/pci.c",0x25,
                  "void enable_dma(const char *)");
  }
  uStack_2438 = 0x104c03;
  iVar4 = close(__fd);
  if (iVar4 != -1) {
    return;
  }
  puVar12 = auStack_2420;
  uStack_2438 = 0x104ca5;
  enable_dma_cold_1();
  plVar10 = alStack_3648;
  uStack_2448 = (ulong)__fd;
  pcStack_2440 = __s;
  uStack_2438 = (ulong)uVar3;
  if (VFIO_CONTAINER_FILE_DESCRIPTOR == -1) {
    fprintf(_stderr,"[DEBUG] %s:%d %s(): allocating dma memory via huge page\n",
            "/workspace/llm4binary/github/license_c_cmakelists/emmericp[P]ixy/src/memory.c",0x39,
            "memory_allocate_dma");
    uVar2 = huge_pg_id;
    puVar12 = (undefined1 *)((ulong)(puVar12 + 0x1fffff) & 0xffffffffffe00000);
    if (cVar13 == '\x01' && (undefined1 *)0x200000 < puVar12) {
      memory_allocate_dma_cold_6();
      goto LAB_00104e3f;
    }
    LOCK();
    huge_pg_id = huge_pg_id + 1;
    UNLOCK();
    uVar3 = getpid();
    __s = acStack_3448;
    snprintf(__s,0x1000,"/mnt/huge/ixy-%d-%d",(ulong)uVar3,(ulong)uVar2);
    iVar4 = open(__s,0x42,0x1c0);
    if (iVar4 == -1) goto LAB_00104e4c;
    iVar5 = ftruncate(iVar4,(__off_t)puVar12);
    if (iVar5 == -1) goto LAB_00104e54;
    pcVar6 = (char *)mmap((void *)0x0,(size_t)puVar12,3,0x40001,iVar4,0);
    if (pcVar6 == (char *)0xffffffffffffffff) goto LAB_00104e5c;
    iVar5 = mlock(pcVar6,(size_t)puVar12);
    if (iVar5 != -1) {
      close(iVar4);
      unlink(acStack_3448);
      virt_to_phys(pcVar6);
      return;
    }
  }
  else {
    fprintf(_stderr,"[DEBUG] %s:%d %s(): allocating dma memory via VFIO\n",
            "/workspace/llm4binary/github/license_c_cmakelists/emmericp[P]ixy/src/memory.c",0x2f,
            "memory_allocate_dma");
    vaddr = mmap((void *)0x0,(size_t)puVar12,3,0x54040021,-1,0);
    if (vaddr != (void *)0xffffffffffffffff) {
      vfio_map_dma(vaddr,(uint32_t)puVar12);
      return;
    }
LAB_00104e3f:
    memory_allocate_dma_cold_1();
LAB_00104e4c:
    memory_allocate_dma_cold_5();
LAB_00104e54:
    memory_allocate_dma_cold_4();
LAB_00104e5c:
    pcVar6 = __s;
    memory_allocate_dma_cold_3();
  }
  memory_allocate_dma_cold_2();
  puStack_3668 = puVar12;
  pcStack_3660 = pcVar6;
  uVar9 = sysconf(0x1e);
  __buf_00 = (long *)0x0;
  iVar4 = open("/proc/self/pagemap",0);
  if (iVar4 == -1) {
    virt_to_phys_cold_4();
LAB_00104f1a:
    virt_to_phys_cold_3();
  }
  else {
    __buf_00 = (long *)(((ulong)plVar10 / uVar9) * 8);
    _Var7 = lseek(iVar4,(__off_t)__buf_00,0);
    if (_Var7 == -1) goto LAB_00104f1a;
    __buf_00 = alStack_3878;
    alStack_3878[0] = 0;
    sVar8 = read(iVar4,__buf_00,8);
    if (sVar8 != -1) {
      close(iVar4);
      if (alStack_3878[0] != 0) {
        return;
      }
      goto LAB_00104f2e;
    }
  }
  virt_to_phys_cold_2();
LAB_00104f2e:
  plVar15 = plVar10;
  virt_to_phys_cold_1();
  uVar16 = 0x800;
  if ((int)__buf_00 != 0) {
    uVar16 = (ulong)__buf_00 & 0xffffffff;
  }
  if ((VFIO_CONTAINER_FILE_DESCRIPTOR == -1) && ((int)(0x200000 % uVar16) != 0)) {
    uVar18 = extraout_RAX;
    plVar19 = plVar10;
    memory_allocate_mempool_cold_1();
    uVar16 = (ulong)extraout_EDX;
    if (*(uint *)(plVar15 + 2) < extraout_EDX) {
      fprintf(_stderr,"[WARN ] %s:%d %s(): memory pool %p only has %d free bufs, requested %d\n",
              "/workspace/llm4binary/github/license_c_cmakelists/emmericp[P]ixy/src/memory.c",0x7d,
              "pkt_buf_alloc_batch",plVar15,(ulong)*(uint *)(plVar15 + 2),uVar16,extraout_RAX_00,
              plVar10,uVar9,uVar18,plVar19);
      uVar16 = (ulong)*(uint *)(plVar15 + 2);
    }
    if ((int)uVar16 != 0) {
      lVar1 = plVar15[1];
      uVar9 = (ulong)*(uint *)(plVar15 + 2);
      lVar14 = 0;
      do {
        uVar3 = (int)uVar9 - 1;
        uVar9 = (ulong)uVar3;
        *(ulong *)((long)__buf_00 + lVar14) =
             (ulong)(uint)(*(int *)((long)plVar15 + uVar9 * 4 + 0x14) * (int)lVar1) + *plVar15;
        lVar14 = lVar14 + 8;
      } while (uVar16 << 3 != lVar14);
      *(uint *)(plVar15 + 2) = uVar3;
    }
    return;
  }
  iVar4 = (int)plVar15;
  plVar10 = (long *)malloc(((ulong)plVar15 & 0xffffffff) * 4 + 0x18);
  iVar5 = (int)uVar16;
  uVar3 = 0;
  dVar17 = memory_allocate_dma((ulong)(uint)(iVar5 * iVar4),false);
  *(int *)((long)plVar10 + 0xc) = iVar4;
  *(int *)(plVar10 + 1) = iVar5;
  *plVar10 = (long)dVar17.virt;
  *(int *)(plVar10 + 2) = iVar4;
  if (iVar4 != 0) {
    uVar9 = 0;
    do {
      *(int *)((long)plVar10 + uVar9 * 4 + 0x14) = (int)uVar9;
      virt = (uintptr_t *)((ulong)uVar3 + *plVar10);
      puVar11 = virt;
      if (VFIO_CONTAINER_FILE_DESCRIPTOR == -1) {
        puVar11 = (uintptr_t *)virt_to_phys(virt);
      }
      *virt = (uintptr_t)puVar11;
      *(int *)(virt + 2) = (int)uVar9;
      virt[1] = (uintptr_t)plVar10;
      *(undefined4 *)((long)virt + 0x14) = 0;
      uVar9 = uVar9 + 1;
      uVar3 = uVar3 + iVar5;
    } while (((ulong)plVar15 & 0xffffffff) != uVar9);
  }
  return;
}

Assistant:

void remove_driver(const char* pci_addr) {
	char path[PATH_MAX];
	snprintf(path, PATH_MAX, "/sys/bus/pci/devices/%s/driver/unbind", pci_addr);
	int fd = open(path, O_WRONLY);
	if (fd == -1) {
		debug("no driver loaded");
		return;
	}
	if (write(fd, pci_addr, strlen(pci_addr)) != (ssize_t) strlen(pci_addr)) {
		warn("failed to unload driver for device %s", pci_addr);
	}
	check_err(close(fd), "close");
}